

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

FILE_FORMAT license::identify_format(string *license)

{
  bool bVar1;
  FILE_FORMAT local_14;
  FILE_FORMAT result;
  string *license_local;
  
  local_14 = UNKNOWN;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (license,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)b64_abi_cxx11_,
                     0);
  if (bVar1) {
    local_14 = BASE64;
  }
  else {
    bVar1 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (license,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                               iniSection_abi_cxx11_,0);
    if (bVar1) {
      local_14 = INI;
    }
  }
  return local_14;
}

Assistant:

FILE_FORMAT identify_format(const string &license) {
	FILE_FORMAT result = UNKNOWN;
	if (regex_match(license, b64)) {
		result = BASE64;
	} else if (regex_search(license, iniSection)) {
		result = INI;
	}
	return result;
}